

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

CatalogEntryLookup *
duckdb::Catalog::TryLookupEntry
          (CatalogEntryLookup *__return_storage_ptr__,CatalogEntryRetriever *retriever,
          string *catalog,string *schema,EntryLookupInfo *lookup_info,OnEntryNotFound if_not_found)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string *psVar4;
  AttachedDatabase *pAVar5;
  pointer pcVar6;
  SchemaCatalogEntry *pSVar7;
  CatalogEntry *pCVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6;
  pointer pCVar10;
  uint uVar11;
  CatalogException *this;
  CatalogType type;
  CatalogLookup *lookup;
  pointer __args;
  vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2;
  pointer catalog_name;
  undefined8 uVar12;
  undefined8 uStack_398;
  vector<duckdb::CatalogLookup,_true> final_lookups;
  undefined8 uStack_370;
  vector<duckdb::CatalogLookup,_true> lookups;
  string fully_qualified_catalog_name_hint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  string entry_type;
  CatalogEntryLookup lookup_result;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string fully_qualified_name_hint;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined1 local_54;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined1 local_34;
  
  GetCatalogEntries(&entries,retriever,catalog,schema);
  lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  final_lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  final_lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  final_lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::reserve
            (&lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>,
             (long)entries.
                   super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   .
                   super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)entries.
                   super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   .
                   super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6);
  if (entries.super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      entries.super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    catalog_name = entries.
                   super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   .
                   super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    do {
      lookup_result.schema.ptr = (SchemaCatalogEntry *)0x0;
      if (if_not_found == RETURN_NULL) {
        lookup_result.schema.ptr =
             (SchemaCatalogEntry *)GetCatalogEntry(retriever,&catalog_name->catalog);
        if ((Catalog *)lookup_result.schema.ptr == (Catalog *)0x0) {
          (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
          (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
          ErrorData::ErrorData(&__return_storage_ptr__->error);
          goto LAB_00d354e8;
        }
      }
      else {
        lookup_result.schema.ptr =
             (SchemaCatalogEntry *)GetCatalog(retriever,&catalog_name->catalog);
      }
      optional_ptr<duckdb::Catalog,_true>::CheckValid
                ((optional_ptr<duckdb::Catalog,_true> *)&lookup_result);
      uVar11 = (*((lookup_result.schema.ptr)->super_InCatalogEntry).super_CatalogEntry.
                 _vptr_CatalogEntry[0x18])
                         (lookup_result.schema.ptr,(ulong)lookup_info->catalog_type);
      if ((char)uVar11 == '\x01') {
        optional_ptr<duckdb::Catalog,_true>::CheckValid
                  ((optional_ptr<duckdb::Catalog,_true> *)&lookup_result);
        this_00 = (vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>> *)
                  &final_lookups;
LAB_00d34fa5:
        ::std::vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>>::
        emplace_back<duckdb::Catalog&,std::__cxx11::string&,duckdb::EntryLookupInfo_const&>
                  (this_00,(Catalog *)lookup_result.schema.ptr,&catalog_name->schema,lookup_info);
      }
      else if ((uVar11 & 0xff) == 0) {
        optional_ptr<duckdb::Catalog,_true>::CheckValid
                  ((optional_ptr<duckdb::Catalog,_true> *)&lookup_result);
        this_00 = (vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>> *)&lookups;
        goto LAB_00d34fa5;
      }
      catalog_name = catalog_name + 1;
    } while (catalog_name !=
             entries.
             super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar10 = final_lookups.
            super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
            super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (final_lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
      super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
      super__Vector_impl_data._M_start !=
      final_lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
      super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __args = final_lookups.
             super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::
      emplace_back<duckdb::CatalogLookup>
                (&lookups.
                  super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>,__args
                );
      __args = __args + 1;
    } while (__args != pCVar10);
  }
  TryLookupEntry(&lookup_result,retriever,&lookups,lookup_info,if_not_found);
  if (lookup_info->catalog_type == TABLE_ENTRY) {
    params_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
    TryLookupDefaultTable(__return_storage_ptr__,retriever,catalog,schema,lookup_info,RETURN_NULL);
    if ((__return_storage_ptr__->entry).ptr != (CatalogEntry *)0x0) {
      if (CONCAT44(lookup_result.entry.ptr._4_4_,lookup_result.entry.ptr._0_4_) != 0) {
        psVar4 = lookup_info->name;
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&lookup_result.entry);
        CatalogTypeToString_abi_cxx11_
                  (&entry_type,
                   (duckdb *)
                   (ulong)*(byte *)(CONCAT44(lookup_result.entry.ptr._4_4_,
                                             lookup_result.entry.ptr._0_4_) + 0x10),type);
        fully_qualified_name_hint._M_dataplus._M_p = (pointer)&fully_qualified_name_hint.field_2;
        fully_qualified_name_hint._M_string_length = 0;
        fully_qualified_name_hint.field_2._M_local_buf[0] = '\0';
        if (lookup_result.schema.ptr != (SchemaCatalogEntry *)0x0) {
          local_40 = 0x73252e732527203a;
          local_38 = 0x2773252e;
          local_48 = 0xc;
          local_34 = 0;
          local_50 = &local_40;
          optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&lookup_result.schema);
          pAVar5 = (((lookup_result.schema.ptr)->super_InCatalogEntry).catalog)->db;
          pcVar6 = (pAVar5->super_CatalogEntry).name._M_dataplus._M_p;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar6,
                     pcVar6 + (pAVar5->super_CatalogEntry).name._M_string_length);
          optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&lookup_result.schema);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          pcVar6 = ((lookup_result.schema.ptr)->super_InCatalogEntry).super_CatalogEntry.name.
                   _M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_318,pcVar6,
                     pcVar6 + ((lookup_result.schema.ptr)->super_InCatalogEntry).super_CatalogEntry.
                              name._M_string_length);
          optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&lookup_result.entry);
          lVar9 = *(long *)(CONCAT44(lookup_result.entry.ptr._4_4_,lookup_result.entry.ptr._0_4_) +
                           0x20);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,lVar9,
                     *(long *)(CONCAT44(lookup_result.entry.ptr._4_4_,lookup_result.entry.ptr._0_4_)
                              + 0x28) + lVar9);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&fully_qualified_catalog_name_hint,(StringUtil *)&local_50,&local_f0,&local_318
                     ,&local_110,params_2);
          ::std::__cxx11::string::operator=
                    ((string *)&fully_qualified_name_hint,
                     (string *)&fully_qualified_catalog_name_hint);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fully_qualified_catalog_name_hint._M_dataplus._M_p !=
              &fully_qualified_catalog_name_hint.field_2) {
            operator_delete(fully_qualified_catalog_name_hint._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if (local_50 != &local_40) {
            operator_delete(local_50);
          }
        }
        local_60 = 0x73252e732527203a;
        local_58 = 0x2773252e;
        local_68 = 0xc;
        local_54 = 0;
        local_70 = &local_60;
        optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&__return_storage_ptr__->schema);
        pAVar5 = ((((__return_storage_ptr__->schema).ptr)->super_InCatalogEntry).catalog)->db;
        pcVar6 = (pAVar5->super_CatalogEntry).name._M_dataplus._M_p;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar6,
                   pcVar6 + (pAVar5->super_CatalogEntry).name._M_string_length);
        optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&__return_storage_ptr__->schema);
        pSVar7 = (__return_storage_ptr__->schema).ptr;
        pcVar6 = (pSVar7->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,pcVar6,
                   pcVar6 + (pSVar7->super_InCatalogEntry).super_CatalogEntry.name._M_string_length)
        ;
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&__return_storage_ptr__->entry);
        pCVar8 = (__return_storage_ptr__->entry).ptr;
        pcVar6 = (pCVar8->name)._M_dataplus._M_p;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar6,pcVar6 + (pCVar8->name)._M_string_length);
        StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&fully_qualified_catalog_name_hint,(StringUtil *)&local_70,&local_130,&local_150,
                   &local_170,params_2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        this = (CatalogException *)__cxa_allocate_exception(0x10);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,
                   "Ambiguity detected for \'%s\': this could either refer to the \'%s\' \'%s\', or the attached catalog \'%s\' which has a default table. To avoid this error, either detach the catalog and reattach under a different name, or use a fully qualified name for the \'%s\'%s or for the Catalog Default Table%s."
                   ,"");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar6 = (psVar4->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar6,pcVar6 + psVar4->_M_string_length);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,entry_type._M_dataplus._M_p,
                   entry_type._M_dataplus._M_p + entry_type._M_string_length);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        pcVar6 = (psVar4->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,pcVar6,pcVar6 + psVar4->_M_string_length);
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        pcVar6 = (psVar4->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,pcVar6,pcVar6 + psVar4->_M_string_length);
        local_b0[0] = local_a0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,entry_type._M_dataplus._M_p,
                   entry_type._M_dataplus._M_p + entry_type._M_string_length);
        local_210[0] = local_200;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_210,fully_qualified_name_hint._M_dataplus._M_p,
                   fully_qualified_name_hint._M_dataplus._M_p +
                   fully_qualified_name_hint._M_string_length);
        local_230[0] = local_220;
        uVar12 = 0xd35341;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,fully_qualified_catalog_name_hint._M_dataplus._M_p,
                   fully_qualified_catalog_name_hint._M_dataplus._M_p +
                   fully_qualified_catalog_name_hint._M_string_length);
        params_4._M_string_length = (size_type)local_210;
        params_4._M_dataplus._M_p = (pointer)local_b0;
        params_4.field_2._M_allocated_capacity = (size_type)local_230;
        params_4.field_2._8_8_ = uVar12;
        params_5._M_string_length = (size_type)__return_storage_ptr__;
        params_5._M_dataplus._M_p = (pointer)uStack_398;
        params_5.field_2._M_allocated_capacity =
             (size_type)
             final_lookups.
             super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_start;
        params_5.field_2._8_8_ =
             final_lookups.
             super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        params_6._M_string_length = uStack_370;
        params_6._M_dataplus._M_p =
             (pointer)final_lookups.
                      super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
                      super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        params_6.field_2._M_allocated_capacity =
             (size_type)
             lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_start;
        params_6.field_2._8_8_ =
             lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        CatalogException::
        CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this,&local_190,&local_90,&local_1b0,&local_1d0,&local_1f0,params_4,params_5,
                   params_6);
        __cxa_throw(this,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_00d354ac;
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&(__return_storage_ptr__->error).extra_info);
    pcVar6 = (__return_storage_ptr__->error).final_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &(__return_storage_ptr__->error).final_message.field_2) {
      operator_delete(pcVar6);
    }
    pcVar6 = (__return_storage_ptr__->error).raw_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &(__return_storage_ptr__->error).raw_message.field_2) {
      operator_delete(pcVar6);
    }
  }
  paVar2 = &lookup_result.error.raw_message.field_2;
  *(undefined4 *)&(__return_storage_ptr__->schema).ptr = lookup_result.schema.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->schema).ptr + 4) = lookup_result.schema.ptr._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->entry).ptr = lookup_result.entry.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->entry).ptr + 4) = lookup_result.entry.ptr._4_4_;
  (__return_storage_ptr__->error).initialized = lookup_result.error.initialized;
  (__return_storage_ptr__->error).type = lookup_result.error.type;
  paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
  (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lookup_result.error.raw_message._M_dataplus._M_p == paVar2) {
    *(undefined4 *)paVar1 = lookup_result.error.raw_message.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
         lookup_result.error.raw_message.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
         lookup_result.error.raw_message.field_2._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
         lookup_result.error.raw_message.field_2._12_4_;
  }
  else {
    (__return_storage_ptr__->error).raw_message._M_dataplus._M_p =
         lookup_result.error.raw_message._M_dataplus._M_p;
    (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
         CONCAT44(lookup_result.error.raw_message.field_2._M_allocated_capacity._4_4_,
                  lookup_result.error.raw_message.field_2._M_allocated_capacity._0_4_);
  }
  paVar3 = &lookup_result.error.final_message.field_2;
  (__return_storage_ptr__->error).raw_message._M_string_length =
       lookup_result.error.raw_message._M_string_length;
  lookup_result.error.raw_message._M_string_length = 0;
  lookup_result.error.raw_message.field_2._M_allocated_capacity._0_4_ =
       lookup_result.error.raw_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
  (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lookup_result.error.final_message._M_dataplus._M_p == paVar3) {
    *(undefined4 *)paVar1 = lookup_result.error.final_message.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
         lookup_result.error.final_message.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
         lookup_result.error.final_message.field_2._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
         lookup_result.error.final_message.field_2._12_4_;
  }
  else {
    (__return_storage_ptr__->error).final_message._M_dataplus._M_p =
         lookup_result.error.final_message._M_dataplus._M_p;
    (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
         CONCAT44(lookup_result.error.final_message.field_2._M_allocated_capacity._4_4_,
                  lookup_result.error.final_message.field_2._M_allocated_capacity._0_4_);
  }
  (__return_storage_ptr__->error).final_message._M_string_length =
       lookup_result.error.final_message._M_string_length;
  lookup_result.error.final_message._M_string_length = 0;
  lookup_result.error.final_message.field_2._M_allocated_capacity._0_4_ =
       lookup_result.error.final_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  lookup_result.error.raw_message._M_dataplus._M_p = (pointer)paVar2;
  lookup_result.error.final_message._M_dataplus._M_p = (pointer)paVar3;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(__return_storage_ptr__->error).extra_info,&lookup_result.error.extra_info);
LAB_00d354ac:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&lookup_result.error.extra_info);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lookup_result.error.final_message._M_dataplus._M_p !=
      &lookup_result.error.final_message.field_2) {
    operator_delete(lookup_result.error.final_message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lookup_result.error.raw_message._M_dataplus._M_p !=
      &lookup_result.error.raw_message.field_2) {
    operator_delete(lookup_result.error.raw_message._M_dataplus._M_p);
  }
LAB_00d354e8:
  ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::~vector
            (&final_lookups.
              super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>);
  ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::~vector
            (&lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&entries.
              super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>)
  ;
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupEntry(CatalogEntryRetriever &retriever, const string &catalog,
                                           const string &schema, const EntryLookupInfo &lookup_info,
                                           OnEntryNotFound if_not_found) {
	auto entries = GetCatalogEntries(retriever, catalog, schema);
	vector<CatalogLookup> lookups;
	vector<CatalogLookup> final_lookups;
	lookups.reserve(entries.size());
	for (auto &entry : entries) {
		optional_ptr<Catalog> catalog_entry;
		if (if_not_found == OnEntryNotFound::RETURN_NULL) {
			catalog_entry = Catalog::GetCatalogEntry(retriever, entry.catalog);
		} else {
			catalog_entry = &Catalog::GetCatalog(retriever, entry.catalog);
		}
		if (!catalog_entry) {
			return {nullptr, nullptr, ErrorData()};
		}
		D_ASSERT(catalog_entry);
		auto lookup_behavior = catalog_entry->CatalogTypeLookupRule(lookup_info.GetCatalogType());
		if (lookup_behavior == CatalogLookupBehavior::STANDARD) {
			lookups.emplace_back(*catalog_entry, entry.schema, lookup_info);
		} else if (lookup_behavior == CatalogLookupBehavior::LOWER_PRIORITY) {
			final_lookups.emplace_back(*catalog_entry, entry.schema, lookup_info);
		}
	}

	for (auto &lookup : final_lookups) {
		lookups.emplace_back(std::move(lookup));
	}

	// Do the main lookup
	auto lookup_result = TryLookupEntry(retriever, lookups, lookup_info, if_not_found);

	// Special case for tables: we do a second lookup searching for catalogs with default tables that also match this
	// lookup
	if (lookup_info.GetCatalogType() == CatalogType::TABLE_ENTRY) {
		auto lookup_result_default_table =
		    TryLookupDefaultTable(retriever, catalog, schema, lookup_info, OnEntryNotFound::RETURN_NULL);

		if (lookup_result_default_table.Found() && lookup_result.Found()) {
			ThrowDefaultTableAmbiguityException(lookup_result, lookup_result_default_table, lookup_info.GetEntryName());
		}

		if (lookup_result_default_table.Found()) {
			return lookup_result_default_table;
		}
	}

	return lookup_result;
}